

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_encode_field_value(amqp_bytes_t encoded,amqp_field_value_t *entry,size_t *offset)

{
  amqp_bytes_t input;
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  amqp_bytes_t encoded_04;
  amqp_bytes_t encoded_05;
  amqp_bytes_t encoded_06;
  amqp_bytes_t encoded_07;
  amqp_bytes_t encoded_08;
  amqp_bytes_t encoded_09;
  amqp_bytes_t encoded_10;
  amqp_bytes_t encoded_11;
  amqp_bytes_t encoded_12;
  amqp_bytes_t encoded_13;
  amqp_bytes_t encoded_14;
  amqp_bytes_t encoded_15;
  amqp_bytes_t encoded_16;
  amqp_bytes_t encoded_17;
  amqp_bytes_t encoded_18;
  int iVar1;
  uint uVar2;
  amqp_table_t *in_RCX;
  byte *in_RDX;
  void *in_RDI;
  int res;
  size_t *in_stack_ffffffffffffffc8;
  undefined2 uVar3;
  undefined1 uVar4;
  uint8_t in_stack_ffffffffffffffd7;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  
  iVar6 = -2;
  encoded_00.bytes = in_RDX;
  encoded_00.len = (size_t)in_RCX;
  iVar1 = amqp_encode_8(encoded_00,(size_t *)CONCAT44(0xfffffffe,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd7);
  if (iVar1 == 0) {
    return iVar6;
  }
  uVar2 = *in_RDX - 0x41;
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  switch(uVar2) {
  case 0:
    encoded_17.bytes = in_RDI;
    encoded_17.len = (size_t)in_RDX;
    iVar1 = amqp_encode_array(encoded_17,(amqp_array_t *)in_RCX,
                              (size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8));
    return iVar1;
  case 1:
    encoded_03.bytes = in_RDX;
    encoded_03.len = (size_t)in_RCX;
    iVar1 = amqp_encode_8(encoded_03,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),'\0');
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  default:
    return -10;
  case 3:
    encoded_12.bytes = in_RDX;
    encoded_12.len = (size_t)in_RCX;
    iVar1 = amqp_encode_8(encoded_12,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),'\0');
    if ((iVar1 == 0) ||
       (encoded_13.bytes = in_RDX, encoded_13.len = (size_t)in_RCX,
       iVar1 = amqp_encode_32(encoded_13,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),
                              CONCAT13(uVar5,CONCAT12(uVar4,uVar3))), iVar1 == 0)) {
      return -0xb;
    }
    break;
  case 5:
    encoded_18.bytes = in_RDI;
    encoded_18.len = (size_t)in_RDX;
    iVar1 = amqp_encode_table(encoded_18,in_RCX,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8))
    ;
    return iVar1;
  case 8:
    encoded_06.bytes = in_RDX;
    encoded_06.len = (size_t)in_RCX;
    iVar1 = amqp_encode_32(encoded_06,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0xb:
    encoded_09.bytes = in_RDX;
    encoded_09.len = (size_t)in_RCX;
    iVar1 = amqp_encode_64(encoded_09,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),
                           (ulong)uVar2);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x12:
  case 0x37:
    encoded_14.bytes = in_RDX;
    encoded_14.len = (size_t)in_RCX;
    iVar1 = amqp_encode_32(encoded_14,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),0);
    if ((iVar1 == 0) ||
       (encoded_15.bytes = in_RDX, encoded_15.len = (size_t)in_RCX, input.len._4_2_ = uVar3,
       input.len._0_4_ = uVar2, input.len._6_1_ = uVar4, input.len._7_1_ = uVar5,
       input.bytes._0_4_ = in_stack_ffffffffffffffd8, input.bytes._4_4_ = iVar6,
       iVar1 = amqp_encode_bytes(encoded_15,in_stack_ffffffffffffffc8,input), iVar1 == 0)) {
      return -0xb;
    }
    break;
  case 0x13:
    encoded_16.bytes = in_RDX;
    encoded_16.len = (size_t)in_RCX;
    iVar1 = amqp_encode_64(encoded_16,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),
                           (ulong)uVar2);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x15:
    break;
  case 0x21:
    encoded_02.bytes = in_RDX;
    encoded_02.len = (size_t)in_RCX;
    iVar1 = amqp_encode_8(encoded_02,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),'\0');
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x23:
    encoded_11.bytes = in_RDX;
    encoded_11.len = (size_t)in_RCX;
    iVar1 = amqp_encode_64(encoded_11,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),
                           (ulong)uVar2);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x25:
    encoded_10.bytes = in_RDX;
    encoded_10.len = (size_t)in_RCX;
    iVar1 = amqp_encode_32(encoded_10,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x28:
    encoded_07.bytes = in_RDX;
    encoded_07.len = (size_t)in_RCX;
    iVar1 = amqp_encode_32(encoded_07,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x2b:
    encoded_08.bytes = in_RDX;
    encoded_08.len = (size_t)in_RCX;
    iVar1 = amqp_encode_64(encoded_08,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),
                           (ulong)uVar2);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x32:
    encoded_04.bytes = in_RDX;
    encoded_04.len = (size_t)in_RCX;
    iVar1 = amqp_encode_16(encoded_04,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x33:
    encoded_01.bytes = in_RDX;
    encoded_01.len = (size_t)in_RCX;
    iVar1 = amqp_encode_8(encoded_01,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),'\0');
    if (iVar1 == 0) {
      return -0xb;
    }
    break;
  case 0x34:
    encoded_05.bytes = in_RDX;
    encoded_05.len = (size_t)in_RCX;
    iVar1 = amqp_encode_16(encoded_05,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) {
      return -0xb;
    }
  }
  return 0;
}

Assistant:

static int amqp_encode_field_value(amqp_bytes_t encoded,
                                   amqp_field_value_t *entry, size_t *offset) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_encode_8(encoded, offset, entry->kind)) {
    goto out;
  }

#define FIELD_ENCODER(bits, val)                   \
  if (!amqp_encode_##bits(encoded, offset, val)) { \
    res = AMQP_STATUS_TABLE_TOO_BIG;               \
    goto out;                                      \
  }                                                \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      FIELD_ENCODER(8, entry->value.boolean ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      FIELD_ENCODER(8, entry->value.i8);
    case AMQP_FIELD_KIND_U8:
      FIELD_ENCODER(8, entry->value.u8);

    case AMQP_FIELD_KIND_I16:
      FIELD_ENCODER(16, entry->value.i16);
    case AMQP_FIELD_KIND_U16:
      FIELD_ENCODER(16, entry->value.u16);

    case AMQP_FIELD_KIND_I32:
      FIELD_ENCODER(32, entry->value.i32);
    case AMQP_FIELD_KIND_U32:
      FIELD_ENCODER(32, entry->value.u32);

    case AMQP_FIELD_KIND_I64:
      FIELD_ENCODER(64, entry->value.i64);
    case AMQP_FIELD_KIND_U64:
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_F32:
      /* by punning, u32 magically gets the right value...! */
      FIELD_ENCODER(32, entry->value.u32);

    case AMQP_FIELD_KIND_F64:
      /* by punning, u64 magically gets the right value...! */
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_encode_8(encoded, offset, entry->value.decimal.decimals) ||
          !amqp_encode_32(encoded, offset, entry->value.decimal.value)) {
        res = AMQP_STATUS_TABLE_TOO_BIG;
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES:
      if (!amqp_encode_32(encoded, offset, (uint32_t)entry->value.bytes.len) ||
          !amqp_encode_bytes(encoded, offset, entry->value.bytes)) {
        res = AMQP_STATUS_TABLE_TOO_BIG;
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_encode_array(encoded, &entry->value.array, offset);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_encode_table(encoded, &entry->value.table, offset);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      res = AMQP_STATUS_INVALID_PARAMETER;
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}